

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.cpp
# Opt level: O2

void multithreading(void)

{
  Header *pHVar1;
  int iVar2;
  char fileName [1];
  OutputFile out;
  InputFile in;
  Header header;
  
  fileName[0] = '\0';
  Imf_3_4::setGlobalThreadCount(4);
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile(&in,fileName,iVar2);
  pHVar1 = (Header *)Imf_3_4::InputFile::header();
  Imf_3_4::Header::Header(&header,pHVar1);
  Imf_3_4::OutputFile::OutputFile(&out,fileName,&header,2);
  Imf_3_4::OutputFile::~OutputFile(&out);
  Imf_3_4::Header::~Header(&header);
  Imf_3_4::InputFile::~InputFile(&in);
  return;
}

Assistant:

void multithreading()
{
    #include "multithreading.cpp"
}